

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

xmlNodePtr xmlNewDocRawNode(xmlDocPtr doc,xmlNsPtr ns,xmlChar *name,xmlChar *content)

{
  xmlNodePtr pxVar1;
  xmlNodePtr pxVar2;
  _xmlNode *local_38;
  xmlNodePtr ulccur;
  xmlNodePtr cur;
  xmlChar *content_local;
  xmlChar *name_local;
  xmlNsPtr ns_local;
  xmlDocPtr doc_local;
  
  pxVar1 = xmlNewDocNode(doc,ns,name,(xmlChar *)0x0);
  if ((pxVar1 != (xmlNodePtr)0x0) && (pxVar1->doc = doc, content != (xmlChar *)0x0)) {
    pxVar2 = xmlNewDocText(doc,content);
    pxVar1->children = pxVar2;
    if (pxVar1 != (xmlNodePtr)0x0) {
      local_38 = pxVar1->children;
      if (local_38 == (_xmlNode *)0x0) {
        pxVar1->last = (_xmlNode *)0x0;
      }
      else {
        for (; local_38->next != (_xmlNode *)0x0; local_38 = local_38->next) {
          local_38->parent = pxVar1;
        }
        local_38->parent = pxVar1;
        pxVar1->last = local_38;
      }
    }
  }
  return pxVar1;
}

Assistant:

xmlNodePtr
xmlNewDocRawNode(xmlDocPtr doc, xmlNsPtr ns,
                 const xmlChar *name, const xmlChar *content) {
    xmlNodePtr cur;

    cur = xmlNewDocNode(doc, ns, name, NULL);
    if (cur != NULL) {
        cur->doc = doc;
	if (content != NULL) {
	    cur->children = xmlNewDocText(doc, content);
	    UPDATE_LAST_CHILD_AND_PARENT(cur)
	}
    }
    return(cur);
}